

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Date.cpp
# Opt level: O1

int asl::yearFromTime(double t)

{
  int iVar1;
  int iVar2;
  int iVar3;
  uint uVar4;
  int iVar5;
  uint uVar6;
  int iVar7;
  double dVar8;
  
  dVar8 = floor(t * 1.1574074074074073e-05);
  iVar2 = (int)dVar8;
  if (iVar2 + 0x5e2aU < 0x11637) {
    uVar6 = (iVar2 + 0x5e2bU) / 0x5b5;
    uVar4 = ((iVar2 + 0x5e2bU) / 0x5b5) * 4 + 0x770;
    iVar7 = uVar6 * -0x5b5 + iVar2 + 0x5e2b;
    if (iVar7 < 0x2db) {
      if (iVar7 < 0x16e) {
        return uVar4;
      }
      return uVar6 * 4 + 0x771;
    }
  }
  else {
    iVar1 = (iVar2 + 0xafaa8) / 0x23ab1;
    iVar2 = iVar1 * -0x23ab1 + iVar2;
    iVar7 = iVar2 + 0xafaa8;
    iVar3 = 0;
    iVar5 = 0;
    if (0x8ead < iVar7) {
      uVar4 = (iVar2 + 0xa6bfbU) / 0x8eac;
      iVar3 = uVar4 + 1;
      iVar5 = uVar4 * -0x8eac + -0x8ead;
    }
    iVar5 = iVar5 + iVar7;
    if (iVar3 == 0) {
      iVar2 = iVar5 / 0x5b5;
      iVar7 = iVar2 * -0x5b5;
    }
    else {
      iVar2 = 0;
      iVar7 = 0;
      if (0x5b4 < iVar5) {
        uVar4 = (iVar5 - 0x5b4U) / 0x5b5;
        iVar2 = uVar4 + 1;
        iVar7 = uVar4 * -0x5b5 + -0x5b4;
      }
    }
    iVar7 = iVar7 + iVar5;
    uVar4 = iVar3 * 100 + iVar1 * 400 + iVar2 * 4;
    if ((iVar3 != 0) && (iVar2 == 0)) {
      return iVar7 / 0x16d + uVar4;
    }
    if (iVar7 < 0x2db) {
      return uVar4 | 0x16d < iVar7;
    }
  }
  return iVar7 < 0x448 ^ 3 | uVar4;
}

Assistant:

static int yearFromTime(double t)
{
	static const int d4y = 365 * 4 + 1;     // 4 year block with 1 leap
	static const int d100y = d4y * 25 - 1;  // 100 year block (except multiples of 400)
	static const int d400y = 4 * d100y + 1; // 400 year block (one more leap for the first year in the block)

	int d = (int)floor(t * (1 / 86400.0)) + d400y * 4 + d100y + 1 + d100y * 2 + d4y - 1 + 16 * d4y + 2 * 365 + 1;
	//(1970 = 4 * 400 + 3 * 100 + 17 * 4 + 2)
	if (d > 695421 && d < 766645) // 1904 - 2099 : all d4y blocks
	{
		d -= 695421;
		int year = 1904;
		int k3 = (d / d4y); // num blocks 4y
		int j3 = k3 * d4y;  // start of current 4y block
		year += k3 * 4;
		d -= j3;
		if (d >= 366 + 365)
			year += (d < 366 + 2 * 365) ? 2 : 3;
		else if (d >= 366)
			year += 1;
		return year;
	}

	int k1 = (d / d400y); // num blocks 400y
	int j1 = k1 * d400y;  // start of current 400y block
	int year = k1 * 400;
	d = d - j1; // time relative to current 400y block
	int k2 = 0, j2 = 0;
	if (d > d100y + 1)
	{
		k2 = 1 + ((d - d100y - 1) / d100y); // num blocks 100y
		j2 = d100y + 1 + (k2 - 1) * d100y;
	}
	year += k2 * 100;
	d = d - j2;
	int k3 = 0, j3 = 0;
	if (k2 == 0) // first 100y block -> all d4y
	{
		k3 = (d / d4y); // num blocks 4y
		j3 = k3 * d4y;  // start of current 4y block
	}
	else if (d > d4y - 1)
	{
		k3 = 1 + ((d - d4y + 1) / d4y);
		j3 = d4y - 1 + (k3 - 1) * d4y;
	}
	d = d - j3; // time relative to current 4y block
	year += k3 * 4;
	if (k3 == 0 && k2 != 0) // all 365d
		year += (d / 365);
	else if (d >= 366 + 365)
		year += (d < 366 + 2 * 365) ? 2 : 3;
	else if (d >= 366)
		year += 1;
	return year;
}